

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactorRational::solveUleft
          (CLUFactorRational *this,Rational *vec,int *vecidx,Rational *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  pointer v;
  type t;
  Rational x;
  Rational y;
  uint local_188;
  uint local_184;
  longlong local_180;
  CLUFactorRational *local_178;
  int local_16c;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_168;
  char local_153;
  char local_152;
  uint local_148;
  void *local_140;
  char local_133;
  char local_132;
  data_type local_128;
  undefined4 local_118;
  undefined2 local_114;
  char local_112;
  data_type local_108;
  undefined4 local_f8;
  undefined2 local_f4;
  char local_f2;
  int *local_e8;
  int *local_e0;
  Rational *local_d8;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_d0;
  data_type local_c8;
  undefined4 local_b8;
  undefined2 local_b4;
  char local_b2;
  data_type local_a8;
  undefined4 local_98;
  undefined2 local_94;
  char local_92;
  int *local_80;
  int *local_78;
  int *local_70;
  Rational *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  long local_40;
  int *local_38;
  
  uVar10 = 0;
  local_128.la[0] = 0;
  local_118 = 1;
  local_114 = 0x100;
  local_112 = '\0';
  local_108.la[0] = 1;
  local_f8 = 1;
  local_f4 = 0x100;
  local_f2 = '\0';
  local_c8.la[0] = 0;
  local_b8 = 1;
  local_b4 = 0x100;
  local_b2 = '\0';
  local_a8.la[0] = 1;
  local_98 = 1;
  local_94 = 0x100;
  local_92 = '\0';
  local_60 = (this->row).orig;
  local_50 = (this->col).orig;
  local_e0 = (this->col).perm;
  if (0 < rhsn) {
    uVar3 = 0;
    do {
      iVar1 = local_e0[rhsidx[uVar3]];
      if (uVar3 == 0) {
        uVar7 = 0;
      }
      else {
        uVar8 = uVar3 & 0xffffffff;
        do {
          uVar9 = (uint)uVar8 - 1;
          uVar6 = uVar9 >> 1;
          uVar7 = (uint)uVar8;
          if (rhsidx[uVar6] <= iVar1) break;
          rhsidx[uVar8] = rhsidx[uVar6];
          uVar8 = (ulong)uVar6;
          uVar7 = uVar6;
        } while (1 < uVar9);
      }
      uVar3 = uVar3 + 1;
      rhsidx[(int)uVar7] = iVar1;
    } while (uVar3 != (uint)rhsn);
  }
  local_188 = rhsn;
  local_178 = this;
  local_d8 = rhs;
  local_68 = vec;
  local_58 = vecidx;
  if (0 < rhsn) {
    local_78 = (this->u).row.idx;
    local_80 = (this->u).row.start;
    local_70 = (this->u).row.len;
    uVar10 = 0;
    local_e8 = rhsidx;
    do {
      iVar1 = deQueueMinRat(local_e8,(int *)&local_188);
      pcVar5 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(local_d8 + local_50[iVar1]);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_128.ld,pcVar5);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_108.ld,pcVar5 + 1);
      local_168.arg1 = (pointer)0x0;
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                   *)pcVar5,(longlong *)&local_168);
      local_180 = 0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_168,&local_180,(type *)0x0);
      iVar2 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_128.ld,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_168);
      if ((local_133 == '\0') && (local_132 == '\0')) {
        operator_delete(local_140,(ulong)local_148 << 3);
      }
      if ((local_153 == '\0') && (local_152 == '\0')) {
        operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
      }
      if (iVar2 != 0) {
        iVar1 = local_60[iVar1];
        local_58[(int)uVar10] = iVar1;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_128.ld,
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)((local_178->diag).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar1));
        pcVar5 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(local_68 + iVar1);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign(pcVar5,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&local_128.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign(pcVar5 + 1,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_108.ld);
        local_184 = local_188;
        local_48 = uVar10;
        if (local_70[iVar1] != 0) {
          piVar4 = local_78 + local_80[iVar1];
          v = (local_178->u).row.val.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_80[iVar1];
          local_16c = local_70[iVar1];
          do {
            local_40 = (long)*piVar4;
            pcVar5 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)(local_d8 + local_40);
            local_38 = piVar4;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_c8.ld,pcVar5);
            local_d0 = pcVar5 + 1;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_a8.ld,local_d0);
            local_180 = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_168,&local_180,(type *)0x0);
            iVar1 = boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_c8.ld,
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_168);
            if ((local_133 == '\0') && (local_132 == '\0')) {
              operator_delete(local_140,(ulong)local_148 << 3);
            }
            if ((local_153 == '\0') && (local_152 == '\0')) {
              operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
            }
            if (iVar1 == 0) {
              local_168.arg2 = (type)&local_128;
              local_168.arg1 = v;
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::
              do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_c8.ld,&local_168,(multiply_immediates *)&local_180);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::negate((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_c8.ld);
              local_180 = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_168,&local_180,(type *)0x0);
              iVar1 = boost::multiprecision::backends::
                      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_c8.ld,
                                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_168);
              if ((local_133 == '\0') && (local_132 == '\0')) {
                operator_delete(local_140,(ulong)local_148 << 3);
              }
              if ((local_153 == '\0') && (local_152 == '\0')) {
                operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
              }
              if (iVar1 != 0) {
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(pcVar5,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                 *)&local_c8.ld);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(local_d0,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   *)&local_a8.ld);
                iVar1 = local_e0[local_40];
                uVar7 = local_184;
                if (0 < (int)local_184) {
                  do {
                    uVar6 = uVar7 - 1;
                    uVar9 = uVar6 >> 1;
                    if (local_e8[uVar9] <= iVar1) break;
                    local_e8[uVar7] = local_e8[uVar9];
                    uVar7 = uVar9;
                  } while (1 < uVar6);
                }
                local_184 = local_184 + 1;
                local_e8[(int)uVar7] = iVar1;
              }
            }
            else {
              boost::multiprecision::default_ops::
              eval_multiply_subtract<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_c8.ld,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_128.ld,&v->m_backend);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign(pcVar5,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               *)&local_c8.ld);
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign(local_d0,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                 *)&local_a8.ld);
            }
            piVar4 = local_38 + 1;
            v = v + 1;
            local_16c = local_16c + -1;
          } while (local_16c != 0);
        }
        uVar10 = (ulong)((int)local_48 + 1);
        local_188 = local_184;
      }
    } while (0 < (int)local_188);
  }
  if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
    operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
  }
  if ((local_b4._1_1_ == '\0') && (local_b2 == '\0')) {
    operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
  }
  if ((local_f4._1_1_ == '\0') && (local_f2 == '\0')) {
    operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
  }
  if ((local_114._1_1_ == '\0') && (local_112 == '\0')) {
    operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
  }
  return (int)uVar10;
}

Assistant:

inline int CLUFactorRational::solveUleft(Rational* vec, int* vecidx,
      Rational* rhs, int* rhsidx, int rhsn)
{
   Rational x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   Rational* val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMinRat(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   VectorRational& rval = u.row.val;

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMinRat(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(x != 0)
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.val.dim());
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(y != 0)
               {
                  rhs[j] = y;
                  enQueueMinRat(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               //               rhs[j] = ( y != 0 ) ? y : SOPLEX_MARKER;
               rhs[j] = y;
            }
         }
      }
   }

   return n;
}